

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzinterpolationspace.cpp
# Opt level: O0

void __thiscall
TPZInterpolationSpace::ReallyComputeSolutionT<std::complex<double>>
          (TPZInterpolationSpace *this,TPZMaterialDataT<std::complex<double>_> *data)

{
  double __r;
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  TPZCompMesh *pTVar3;
  TPZManVector<std::complex<double>,_10> *pTVar4;
  int64_t iVar5;
  TPZFNMatrix<30,_std::complex<double>_> *pTVar6;
  undefined4 extraout_var_00;
  long in_RSI;
  TPZFMatrix<std::complex<double>_> *in_RDI;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  int d;
  int64_t is_1;
  int jn;
  int64_t pos;
  int dfvar;
  int64_t dfseq;
  TPZConnect *df;
  int in;
  int64_t iv;
  TPZCompEl *in_stack_000000c0;
  int is;
  int solVecSize;
  int64_t numbersol;
  TPZFMatrix<std::complex<double>_> *MeshSol;
  TPZBlock *block;
  int ncon;
  int nstate;
  TPZGradSolVec<std::complex<double>_> *dsol;
  TPZSolVec<std::complex<double>_> *sol;
  TPZFMatrix<double> *axes;
  TPZFMatrix<double> *dphix;
  TPZFMatrix<double> *phi;
  undefined4 in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffedc;
  TPZSolutionMatrix *in_stack_fffffffffffffee0;
  TPZFNMatrix<30,_std::complex<double>_> *in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  complex<double> local_f8;
  int64_t in_stack_ffffffffffffff18;
  int64_t in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  int iVar7;
  TPZVec<std::complex<double>_> *in_stack_ffffffffffffff30;
  long local_b0;
  int local_a4;
  uint local_7c;
  long local_78;
  complex<double> local_70;
  int local_60;
  int local_5c;
  int64_t local_58;
  TPZFMatrix<std::complex<double>_> *local_50;
  TPZBlock *local_48;
  int local_40;
  int local_3c;
  TPZVec<TPZFNMatrix<30,_std::complex<double>_>_> *local_38;
  TPZVec<TPZManVector<std::complex<double>,_10>_> *local_30;
  long local_28;
  TPZBaseMatrix *local_20;
  long *local_18;
  
  local_18 = (long *)(in_RSI + 0x3900);
  local_20 = (TPZBaseMatrix *)(in_RSI + 0x3a38);
  local_28 = in_RSI + 0x3f20;
  local_30 = (TPZVec<TPZManVector<std::complex<double>,_10>_> *)(in_RSI + 0x48d0);
  local_38 = (TPZVec<TPZFNMatrix<30,_std::complex<double>_>_> *)(in_RSI + 0x57f0);
  iVar1 = (*(in_RDI->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0x17])();
  local_3c = (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x78))();
  local_40 = (*(in_RDI->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable
               ._vptr_TPZSavable[0x12])();
  pTVar3 = TPZCompEl::Mesh(in_stack_000000c0);
  local_48 = TPZCompMesh::Block(pTVar3);
  pTVar3 = TPZCompEl::Mesh(in_stack_000000c0);
  TPZCompMesh::Solution(pTVar3);
  local_50 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_(in_stack_fffffffffffffee0);
  local_58 = TPZBaseMatrix::Cols((TPZBaseMatrix *)local_50);
  iVar1 = local_3c;
  if (local_40 == 0) {
    iVar1 = 0;
  }
  local_5c = iVar1;
  (*local_30->_vptr_TPZVec[4])(local_30,local_58);
  (*local_38->_vptr_TPZVec[4])(local_38,local_58);
  for (local_60 = 0; local_60 < local_58; local_60 = local_60 + 1) {
    pTVar4 = TPZVec<TPZManVector<std::complex<double>,_10>_>::operator[](local_30,(long)local_60);
    (*(pTVar4->super_TPZVec<std::complex<double>_>)._vptr_TPZVec[3])(pTVar4,(long)local_5c);
    TPZVec<TPZManVector<std::complex<double>,_10>_>::operator[](local_30,(long)local_60);
    std::complex<double>::complex(&local_70,0.0,0.0);
    TPZVec<std::complex<double>_>::Fill
              (in_stack_ffffffffffffff30,
               (complex<double> *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
               in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    in_stack_fffffffffffffef0 =
         TPZVec<TPZFNMatrix<30,_std::complex<double>_>_>::operator[](local_38,(long)local_60);
    iVar5 = TPZBaseMatrix::Rows(local_20);
    (*(in_stack_fffffffffffffef0->super_TPZFMatrix<std::complex<double>_>).
      super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
      [0xe])(in_stack_fffffffffffffef0,iVar5,(long)local_5c);
    pTVar6 = TPZVec<TPZFNMatrix<30,_std::complex<double>_>_>::operator[](local_38,(long)local_60);
    (*(pTVar6->super_TPZFMatrix<std::complex<double>_>).super_TPZMatrix<std::complex<double>_>.
      super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xf])();
  }
  local_78 = 0;
  for (local_7c = 0; (int)local_7c < local_40; local_7c = local_7c + 1) {
    iVar2 = (*(in_RDI->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable[0x15])(in_RDI,(ulong)local_7c);
    TPZConnect::SequenceNumber((TPZConnect *)CONCAT44(extraout_var_00,iVar2));
    iVar2 = TPZBlock::Size((TPZBlock *)in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
    TPZBlock::Position((TPZBlock *)in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
    for (local_a4 = 0; local_a4 < iVar2; local_a4 = local_a4 + 1) {
      for (local_b0 = 0; local_b0 < local_58; local_b0 = local_b0 + 1) {
        __r = (double)(**(code **)(*local_18 + 0x108))(local_18,local_78 / (long)local_3c,0);
        std::complex<double>::complex((complex<double> *)&stack0xffffffffffffff30,__r,0.0);
        TPZFMatrix<std::complex<double>_>::operator()
                  (in_RDI,CONCAT44(iVar1,in_stack_fffffffffffffef8),
                   (int64_t)in_stack_fffffffffffffef0);
        std::operator*((complex<double> *)
                       CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                       (complex<double> *)0x1b1c80c);
        pTVar4 = TPZVec<TPZManVector<std::complex<double>,_10>_>::operator[](local_30,local_b0);
        TPZVec<std::complex<double>_>::operator[]
                  (&pTVar4->super_TPZVec<std::complex<double>_>,local_78 % (long)local_3c);
        std::complex<double>::operator+=
                  ((complex<double> *)in_stack_fffffffffffffee0,
                   (complex<double> *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8))
        ;
        iVar7 = 0;
        while( true ) {
          in_stack_fffffffffffffee0 = (TPZSolutionMatrix *)(long)iVar7;
          iVar5 = TPZBaseMatrix::Rows(local_20);
          if (iVar5 <= (long)in_stack_fffffffffffffee0) break;
          (*(local_20->super_TPZSavable)._vptr_TPZSavable[0x21])
                    (local_20,(long)iVar7,local_78 / (long)local_3c);
          std::complex<double>::complex
                    (&local_f8,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da),0.0);
          TPZFMatrix<std::complex<double>_>::operator()
                    (in_RDI,CONCAT44(iVar1,in_stack_fffffffffffffef8),
                     (int64_t)in_stack_fffffffffffffef0);
          std::operator*((complex<double> *)
                         CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                         (complex<double> *)0x1b1c8f4);
          TPZVec<TPZFNMatrix<30,_std::complex<double>_>_>::operator[](local_38,local_b0);
          TPZFMatrix<std::complex<double>_>::operator()
                    (in_RDI,CONCAT44(iVar1,in_stack_fffffffffffffef8),
                     (int64_t)in_stack_fffffffffffffef0);
          std::complex<double>::operator+=
                    ((complex<double> *)in_stack_fffffffffffffee0,
                     (complex<double> *)
                     CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
          iVar7 = iVar7 + 1;
        }
      }
      local_78 = local_78 + 1;
    }
  }
  return;
}

Assistant:

void TPZInterpolationSpace::ReallyComputeSolutionT(TPZMaterialDataT<TVar>& data){
    const TPZFMatrix<REAL> &phi = data.phi;
    const TPZFMatrix<REAL> &dphix = data.dphix;
    const TPZFMatrix<REAL> &axes = data.axes;
    TPZSolVec<TVar> &sol = data.sol;
    TPZGradSolVec<TVar> &dsol = data.dsol;
	const int nstate = this->Material()->NStateVariables();
	const int ncon = this->NConnects();
	TPZBlock &block = Mesh()->Block();
	TPZFMatrix<TVar> &MeshSol = Mesh()->Solution();
    const int64_t numbersol = MeshSol.Cols();
	
	const int solVecSize = ncon? nstate : 0;
	
    sol.resize(numbersol);
    dsol.resize(numbersol);
    for (int is = 0; is<numbersol; is++) {
        sol[is].Resize(solVecSize);
        sol[is].Fill(0.);
        dsol[is].Redim(dphix.Rows(), solVecSize);
        dsol[is].Zero();
    }	
	int64_t iv = 0;
	for(int in=0; in<ncon; in++) {
		TPZConnect *df = &Connect(in);
		const int64_t dfseq = df->SequenceNumber();
		const int dfvar = block.Size(dfseq);
		const int64_t pos = block.Position(dfseq);
		for(int jn=0; jn<dfvar; jn++) {
            for (int64_t is=0; is<numbersol; is++) {
                sol[is][iv%nstate] +=
                    (TVar)phi.Get(iv/nstate,0)*MeshSol(pos+jn,is);
                for(auto d=0; d<dphix.Rows(); d++){
                    dsol[is](d,iv%nstate) +=
                        (TVar)dphix.Get(d,iv/nstate)*MeshSol(pos+jn,is);
                }
            }
			iv++;
		}
	}
	
}